

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O0

void __thiscall
pstore::error_or<std::tuple<int,pstore::maybe<char,void>>>::
error_or<int&,pstore::maybe<char,void>const&>
          (error_or<std::tuple<int,pstore::maybe<char,void>>> *this,int *param_2,
          maybe<char,_void> *param_3)

{
  storage_type *this_00;
  maybe<char,_void> *args_local_1;
  int *args_local;
  error_or<std::tuple<int,_pstore::maybe<char,_void>_>_> *this_local;
  
  this[0x10] = (error_or<std::tuple<int,pstore::maybe<char,void>>>)0x0;
  this_00 = error_or<std::tuple<int,_pstore::maybe<char,_void>_>_>::get_storage
                      ((error_or<std::tuple<int,_pstore::maybe<char,_void>_>_> *)this);
  std::tuple<int,_pstore::maybe<char,_void>_>::tuple<int_&,_const_pstore::maybe<char,_void>_&,_true>
            (this_00,param_2,param_3);
  return;
}

Assistant:

explicit error_or (in_place_t const inp, Args &&... args)
                : has_error_{false} {
            (void) inp;
            new (get_storage ()) storage_type (std::forward<Args> (args)...);
        }